

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O2

void __thiscall adios2::core::engine::BP5Writer::~BP5Writer(BP5Writer *this)

{
  ~BP5Writer(this);
  operator_delete(this);
  return;
}

Assistant:

BP5Writer::~BP5Writer()
{
    if (m_IsOpen)
    {
        DestructorClose(m_FailVerbose);
    }
    m_IsOpen = false;
}